

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::
GetVectorArgMinMaxFunctionInternal<duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t,long>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *by_type,
          LogicalType *type)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_71;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_70;
  LogicalType local_58 [2];
  
  LogicalType::LogicalType(local_58,by_type);
  LogicalType::LogicalType(local_58 + 1,(LogicalType *)this);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_70,__l,&local_71);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_70,by_type,
             AggregateFunction::StateSize<duckdb::ArgMinMaxState<duckdb::string_t,long>>,
             AggregateFunction::
             StateInitialize<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>,(duckdb::AggregateDestructorType)1>
             ,VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>
              ::Update<duckdb::ArgMinMaxState<duckdb::string_t,long>>,
             AggregateFunction::
             StateCombine<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>>
             ,AggregateFunction::
              StateVoidFinalize<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>>
             ,(aggregate_simple_update_t)0x0,
             VectorArgMinMaxBase<duckdb::GreaterThan,_true,_(duckdb::OrderType)3,_duckdb::SpecializedGenericArgMinMaxState>
             ::Bind,AggregateFunction::
                    StateDestroy<duckdb::ArgMinMaxState<duckdb::string_t,long>,duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_70);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetVectorArgMinMaxFunctionInternal(const LogicalType &by_type, const LogicalType &type) {
#ifndef DUCKDB_SMALLER_BINARY
	using STATE = ArgMinMaxState<ARG_TYPE, BY_TYPE>;
	return AggregateFunction({type, by_type}, type, AggregateFunction::StateSize<STATE>,
	                         AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>,
	                         OP::template Update<STATE>, AggregateFunction::StateCombine<STATE, OP>,
	                         AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, OP::Bind,
	                         AggregateFunction::StateDestroy<STATE, OP>);
#else
	auto function = GetGenericArgMinMaxFunction<OP>();
	function.arguments = {type, by_type};
	function.return_type = type;
	return function;
#endif
}